

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiLogStream aiGetPredefinedLogStream(aiDefaultLogStream pStream,char *file)

{
  aiLogStream aVar1;
  LogStream *local_40;
  LogStream *stream;
  aiLogStream sout;
  char *file_local;
  aiDefaultLogStream pStream_local;
  
  sout.user = file;
  local_40 = Assimp::LogStream::createDefaultStream(pStream,file,(IOSystem *)0x0);
  if (local_40 == (LogStream *)0x0) {
    stream = (LogStream *)0x0;
    sout.callback = (aiLogStreamCallback)0x0;
  }
  else {
    stream = (LogStream *)CallbackToLogRedirector;
    sout.callback = (aiLogStreamCallback)local_40;
  }
  std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::push_back
            ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
             Assimp::gPredefinedStreams_abi_cxx11_,&local_40);
  aVar1.user = (char *)sout.callback;
  aVar1.callback = (aiLogStreamCallback)stream;
  return aVar1;
}

Assistant:

ASSIMP_API aiLogStream aiGetPredefinedLogStream(aiDefaultLogStream pStream,const char* file)
{
    aiLogStream sout;

    ASSIMP_BEGIN_EXCEPTION_REGION();
    LogStream* stream = LogStream::createDefaultStream(pStream,file);
    if (!stream) {
        sout.callback = NULL;
        sout.user = NULL;
    }
    else {
        sout.callback = &CallbackToLogRedirector;
        sout.user = (char*)stream;
    }
    gPredefinedStreams.push_back(stream);
    ASSIMP_END_EXCEPTION_REGION(aiLogStream);
    return sout;
}